

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_camera.c
# Opt level: O2

int main(int argc,char **argv)

{
  double z;
  double dVar1;
  ALLEGRO_COLOR c1;
  ALLEGRO_COLOR c1_00;
  ALLEGRO_COLOR c1_01;
  ALLEGRO_COLOR c1_02;
  ALLEGRO_COLOR c2;
  ALLEGRO_COLOR c2_00;
  ALLEGRO_COLOR c2_01;
  ALLEGRO_COLOR c2_02;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  int extraout_EAX;
  long lVar9;
  undefined8 uVar10;
  Camera *pCVar11;
  undefined8 uVar12;
  float *pfVar13;
  long lVar14;
  Camera *pCVar15;
  char *pcVar16;
  int iVar17;
  int iVar18;
  double dVar19;
  double dVar20;
  double x;
  double u;
  double x_00;
  float fVar21;
  double dVar22;
  double y;
  undefined4 uVar23;
  undefined4 uVar24;
  double x_01;
  ALLEGRO_COLOR color;
  ALLEGRO_COLOR color_00;
  ALLEGRO_COLOR color_01;
  ALLEGRO_COLOR color_02;
  ALLEGRO_COLOR color_03;
  ALLEGRO_COLOR color_04;
  ALLEGRO_COLOR color_05;
  ALLEGRO_COLOR color_06;
  Vector VVar25;
  Vector b;
  Vector VVar26;
  Vector axis;
  Vector axis_00;
  Vector axis_01;
  undefined1 auVar27 [16];
  float afVar28 [4];
  ALLEGRO_COLOR AVar29;
  ALLEGRO_COLOR AVar30;
  ulong uVar31;
  undefined8 in_stack_fffffffffffffdc0;
  double dVar32;
  double pz;
  float local_218;
  float fStack_214;
  float local_1f8;
  double local_188;
  double dStack_180;
  ALLEGRO_TRANSFORM projection_1;
  ALLEGRO_EVENT event;
  ALLEGRO_TRANSFORM projection;
  
  if (argc < 2) {
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar16 = argv[1];
  }
  cVar6 = al_install_system(0x5020700,atexit);
  if (cVar6 == '\0') {
    pcVar16 = "Could not init Allegro.\n";
  }
  else {
    al_init_font_addon();
    al_init_primitives_addon();
    al_install_keyboard();
    al_install_mouse();
    al_set_new_display_option(0x11,1,2);
    al_set_new_display_option(0x12,8,2);
    al_set_new_display_option(0xf,0x10,2);
    al_set_new_display_flags(0x10);
    lVar9 = al_create_display(0x280,0x168);
    if (lVar9 != 0) {
      if (pcVar16 != (char *)0x0) {
        al_init_image_addon();
        ex.skybox = (ALLEGRO_BITMAP *)al_load_bitmap(pcVar16);
        if (ex.skybox == (ALLEGRO_BITMAP *)0x0) {
          printf("Failed loading skybox %s\n",pcVar16);
        }
        else {
          uVar7 = al_get_bitmap_width(ex.skybox);
          uVar8 = al_get_bitmap_height(ex.skybox);
          printf("Loaded skybox %s: %d x %d\n",pcVar16,(ulong)uVar7,(ulong)uVar8);
        }
      }
      uVar10 = al_create_timer(0x3f91111111111111);
      pCVar11 = (Camera *)al_create_event_queue();
      uVar12 = al_get_keyboard_event_source();
      al_register_event_source(pCVar11,uVar12);
      uVar12 = al_get_mouse_event_source();
      al_register_event_source(pCVar11,uVar12);
      uVar12 = al_get_display_event_source(lVar9);
      al_register_event_source(pCVar11,uVar12);
      uVar12 = al_get_timer_event_source(uVar10);
      al_register_event_source(pCVar11,uVar12);
      ex.camera.xaxis.x = 1.0;
      ex.camera.yaxis.y = 1.0;
      ex.camera.zaxis.z = 1.0;
      ex.camera.position.y = 2.0;
      ex.camera.vertical_field_of_view = 1.0471975511965976;
      ex.mouse_look_speed = 0.03;
      ex.movement_speed = 0.05;
      ex.controls_names[0] = "FPS";
      ex.controls_names[1] = "airplane";
      ex.controls_names[2] = "spaceship";
      ex.font = (ALLEGRO_FONT *)al_create_builtin_font();
      al_start_timer(uVar10);
      bVar2 = false;
      do {
        while( true ) {
          pCVar15 = pCVar11;
          al_wait_for_event(pCVar11,&event);
          if (event.type == 10) break;
          if (event.type == 0xc) {
            ex.keystate[event.display.width] = 0;
            goto LAB_0010297d;
          }
          if (event.type == 0x14) {
            ex.mouse_dx = ex.mouse_dx + (int)event.user.data3;
            ex.mouse_dy = ex.mouse_dy + (int)((ulong)event._48_8_ >> 0x20);
            goto LAB_0010297d;
          }
          if (event.type == 0x15) {
            ex.button[event.mouse.button] = 1;
            goto LAB_0010297d;
          }
          if (event.type == 0x16) {
            ex.button[event.mouse.button] = 0;
            goto LAB_0010297d;
          }
          if (event.type != 0x1e) {
            if (event.type == 0x29) {
              al_acknowledge_resize(lVar9);
            }
            else if (event.type == 0x2a) {
              return 0;
            }
            goto LAB_0010297d;
          }
          uVar23 = 0xbff00000;
          if (ex.key[0x52] == 0 && ex.key[1] == 0) {
            uVar23 = 0;
          }
          uVar7 = 0xbff00000;
          if (ex.key[0x55] == 0 && ex.key[0x13] == 0) {
            uVar7 = 0;
          }
          uVar24 = 0x3ff00000;
          if (ex.key[0x53] == 0 && ex.key[4] == 0) {
            uVar24 = uVar23;
          }
          uVar23 = 0;
          uVar8 = 0x3ff00000;
          if (ex.key[0x54] == 0 && ex.key[0x17] == 0) {
            uVar8 = uVar7;
          }
          if (ex.key[0x1a] != 0) {
            dVar19 = ex.camera.vertical_field_of_view + -0.01;
            ex.camera.vertical_field_of_view = 0.3490658503988659;
            if (0.3490658503988659 <= dVar19) {
              ex.camera.vertical_field_of_view = dVar19;
            }
          }
          if (ex.key[0x18] != 0) {
            dVar19 = ex.camera.vertical_field_of_view + 0.01;
            ex.camera.vertical_field_of_view = 2.0943951023931953;
            if (dVar19 <= 2.0943951023931953) {
              ex.camera.vertical_field_of_view = dVar19;
            }
          }
          if (ex.controls == 0) {
            if (2.0 < ex.camera.position.y) {
              ex.camera.position.y = ex.camera.position.y + -0.1;
            }
            if (ex.camera.position.y < 2.0) {
              ex.camera.position.y = 2.0;
            }
LAB_00103560:
            dVar19 = get_roll(pCVar15);
            VVar25.y = ex.camera.zaxis.y;
            VVar25.x = ex.camera.zaxis.x;
            VVar25.z = ex.camera.zaxis.z;
            camera_rotate_around_axis(pCVar15,VVar25,dVar19 / 60.0);
          }
          else if ((ex.controls & 0xfffffffdU) == 0) goto LAB_00103560;
          dVar19 = SQRT((double)CONCAT44(uVar24,uVar23) * (double)CONCAT44(uVar24,uVar23) +
                        (double)((ulong)uVar8 << 0x20) * (double)((ulong)uVar8 << 0x20));
          if (0.0 < dVar19) {
            dVar32 = (double)CONCAT44(uVar24,uVar23) / dVar19;
            dVar19 = (double)((ulong)uVar8 << 0x20) / dVar19;
            if (ex.controls == 0) {
              dVar32 = dVar32 * ex.movement_speed;
              dVar19 = dVar19 * ex.movement_speed;
              VVar25 = get_ground_forward_vector(pCVar15);
              VVar26 = get_ground_right_vector(pCVar15);
              local_1f8 = VVar25.x;
              ex.camera.position.x =
                   (float)((double)ex.camera.position.x +
                          (double)local_1f8 * dVar19 + (double)VVar26.x * dVar32);
              ex.camera.position.z =
                   (float)((double)ex.camera.position.z +
                          (double)VVar25.z * dVar19 + (double)VVar26.z * dVar32);
            }
            else if ((uint)ex.controls < 3) {
              dVar19 = dVar19 * ex.movement_speed;
              fVar21 = (float)(dVar32 * ex.movement_speed);
              VVar26.x = fVar21 * ex.camera.xaxis.x;
              VVar26.y = fVar21 * ex.camera.xaxis.y;
              VVar26.z = fVar21 * ex.camera.xaxis.z;
              vector_iadd(&pCVar15->position,VVar26);
              fVar21 = -(float)dVar19;
              b.x = fVar21 * ex.camera.zaxis.x;
              b.y = fVar21 * ex.camera.zaxis.y;
              b.z = ex.camera.zaxis.z * fVar21;
              vector_iadd(&pCVar15->position,b);
            }
          }
          if (ex.button[1] != 0) {
            if ((ex.controls & 0xfffffffdU) == 0) {
              axis.y = ex.camera.xaxis.y;
              axis.x = ex.camera.xaxis.x;
              axis.z = ex.camera.xaxis.z;
              camera_rotate_around_axis(pCVar15,axis,(double)ex.mouse_dy * -ex.mouse_look_speed);
              camera_rotate_around_axis
                        (pCVar15,(Vector)ZEXT812(0x3f80000000000000),
                         (double)ex.mouse_dx * -ex.mouse_look_speed);
            }
            if (ex.controls == 1) {
              axis_00.y = ex.camera.xaxis.y;
              axis_00.x = ex.camera.xaxis.x;
              axis_00.z = ex.camera.xaxis.z;
              camera_rotate_around_axis(pCVar15,axis_00,(double)ex.mouse_dy * -ex.mouse_look_speed);
              axis_01.y = ex.camera.zaxis.y;
              axis_01.x = ex.camera.zaxis.x;
              axis_01.z = ex.camera.zaxis.z;
              camera_rotate_around_axis(pCVar15,axis_01,(double)ex.mouse_dx * -ex.mouse_look_speed);
            }
          }
          for (lVar14 = -0x38c; lVar14 != 0; lVar14 = lVar14 + 4) {
            if (*(int *)((long)ex.controls_names + lVar14 + -0x10) == 0) {
              *(undefined4 *)((long)ex.keystate + lVar14) = 0;
            }
          }
          ex.mouse_dx = 0;
          ex.mouse_dy = 0;
LAB_00102986:
          cVar6 = al_is_event_queue_empty(pCVar11);
          bVar2 = true;
          if (cVar6 != '\0') {
            pfVar13 = (float *)al_get_current_projection_transform();
            projection.m[0]._0_8_ = *(undefined8 *)pfVar13;
            projection.m[0]._8_8_ = *(undefined8 *)(pfVar13 + 2);
            projection.m[1]._0_8_ = *(undefined8 *)(pfVar13 + 4);
            projection.m[1]._8_8_ = *(undefined8 *)(pfVar13 + 6);
            projection.m[2][0] = pfVar13[8];
            projection.m[2][1] = pfVar13[9];
            projection.m[2][2] = pfVar13[10];
            projection.m[2][3] = pfVar13[0xb];
            projection.m[3][0] = pfVar13[0xc];
            projection.m[3][1] = pfVar13[0xd];
            projection.m[3][2] = pfVar13[0xe];
            projection.m[3][3] = pfVar13[0xf];
            al_color_name("black");
            uVar12 = al_color_name("white");
            uVar10 = al_get_current_display();
            al_get_display_width(uVar10);
            al_get_display_height(uVar10);
            al_identity_transform(&projection_1);
            al_translate_transform_3d(0,&projection_1);
            tan(ex.camera.vertical_field_of_view * 0.5);
            al_perspective_transform(&projection_1);
            al_use_projection_transform(&projection_1);
            al_clear_to_color();
            al_set_render_state(0x12,1);
            al_clear_depth_buffer();
            ex.n = 0;
            auVar27 = al_color_name("yellow");
            uVar10 = auVar27._8_8_;
            uVar23 = auVar27._0_4_;
            fVar21 = auVar27._4_4_;
            afVar28 = (float  [4])al_color_name("green");
            for (iVar18 = 0; fVar5 = ex.camera.position.z, fVar4 = ex.camera.position.y,
                fVar3 = ex.camera.position.x, iVar18 != 0x14; iVar18 = iVar18 + 1) {
              for (iVar17 = 0; iVar17 != 0x14; iVar17 = iVar17 + 1) {
                projection_1.m[0][1] = fVar21;
                projection_1.m[0][0] = (float)uVar23;
                projection_1.m[0][2] = (float)(int)uVar10;
                projection_1.m[0][3] = (float)(int)((ulong)uVar10 >> 0x20);
                dVar19 = 0.2;
                if ((iVar18 + iVar17 & 1U) != 0) {
                  dVar19 = 0.1;
                  projection_1.m[0] = afVar28;
                }
                AVar29.b = (float)uVar23;
                AVar29.r = (float)(int)in_stack_fffffffffffffdc0;
                AVar29.g = (float)(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
                AVar29.a = fVar21;
                AVar30._8_8_ = (double)(iVar18 + -10);
                AVar30.r = (float)(int)uVar10;
                AVar30.g = (float)(int)((ulong)uVar10 >> 0x20);
                add_quad((double)(iVar17 + -10),dVar19,(double)(iVar18 + -10),0.0,0.0,1.0,0.0,0.0,
                         0.0,1.0,0.0,(double)projection_1.m[0]._0_8_,(double)projection_1.m[0]._8_8_
                         ,(double)projection_1.m[0]._0_8_,(double)projection_1.m[0]._8_8_,AVar29,
                         AVar30);
              }
            }
            afVar28 = (float  [4])al_color_name("black");
            projection_1.m[0] = afVar28;
            AVar29 = (ALLEGRO_COLOR)al_color_name("blue");
            local_218 = AVar29.b;
            fStack_214 = AVar29.a;
            AVar30 = (ALLEGRO_COLOR)al_color_name("white");
            if (ex.skybox == (ALLEGRO_BITMAP *)0x0) {
              pz = 0.0;
              dVar19 = 0.0;
            }
            else {
              iVar18 = al_get_bitmap_width();
              pz = (double)iVar18 * 0.25;
              iVar18 = al_get_bitmap_height(ex.skybox);
              dVar19 = (double)iVar18 / 3.0;
              local_218 = AVar30.b;
              fStack_214 = AVar30.a;
              AVar29 = AVar30;
              projection_1.m[0] = (float  [4])AVar30;
            }
            dStack_180 = AVar29._8_8_;
            local_188 = AVar29._0_8_;
            x_01 = (double)(fVar3 + -50.0);
            dVar22 = (double)(fVar4 + -50.0);
            dVar32 = (double)(fVar5 + -50.0);
            dVar20 = dVar19 + dVar19;
            dVar1 = -dVar19;
            c1.b = (float)SUB84(dVar22,0);
            c1.r = (float)(int)in_stack_fffffffffffffdc0;
            c1.g = (float)(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
            c1.a = (float)((ulong)dVar22 >> 0x20);
            c2._8_8_ = pz;
            c2.r = (float)(int)uVar10;
            c2.g = (float)(int)((ulong)uVar10 >> 0x20);
            add_quad(x_01,dVar22,dVar32,pz * 4.0,dVar20,100.0,0.0,-pz,100.0,0.0,dVar1,
                     (double)projection_1.m[0]._0_8_,(double)projection_1.m[0]._8_8_,local_188,
                     dStack_180,c1,c2);
            z = (double)(fVar5 + 50.0);
            c1_00.b = (float)SUB84(dVar22,0);
            c1_00.r = (float)(int)in_stack_fffffffffffffdc0;
            c1_00.g = (float)(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
            c1_00.a = (float)((ulong)dVar22 >> 0x20);
            c2_00._8_8_ = pz;
            c2_00.r = (float)(int)uVar10;
            c2_00.g = (float)(int)((ulong)uVar10 >> 0x20);
            add_quad(x_01,dVar22,z,pz,dVar20,100.0,0.0,pz,100.0,0.0,dVar1,
                     (double)projection_1.m[0]._0_8_,(double)projection_1.m[0]._8_8_,local_188,
                     dStack_180,c1_00,c2_00);
            c1_01.b = (float)SUB84(dVar22,0);
            c1_01.r = (float)(int)in_stack_fffffffffffffdc0;
            c1_01.g = (float)(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
            c1_01.a = (float)((ulong)dVar22 >> 0x20);
            c2_01._8_8_ = pz;
            c2_01.r = (float)(int)uVar10;
            c2_01.g = (float)(int)((ulong)uVar10 >> 0x20);
            add_quad(x_01,dVar22,dVar32,0.0,dVar20,0.0,100.0,pz,100.0,0.0,dVar1,
                     (double)projection_1.m[0]._0_8_,(double)projection_1.m[0]._8_8_,local_188,
                     dStack_180,c1_01,c2_01);
            x = (double)(fVar3 + 50.0);
            c1_02.b = (float)SUB84(dVar22,0);
            c1_02.r = (float)(int)in_stack_fffffffffffffdc0;
            c1_02.g = (float)(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
            c1_02.a = (float)((ulong)dVar22 >> 0x20);
            c2_02._8_8_ = pz;
            c2_02.r = (float)(int)uVar10;
            c2_02.g = (float)(int)((ulong)uVar10 >> 0x20);
            add_quad(x,dVar22,dVar32,pz * 3.0,dVar20,0.0,100.0,-pz,100.0,0.0,dVar1,
                     (double)projection_1.m[0]._0_8_,(double)projection_1.m[0]._8_8_,local_188,
                     dStack_180,c1_02,c2_02);
            y = (double)(fVar4 + 50.0);
            color.a = fStack_214;
            color.b = local_218;
            color._0_8_ = local_188;
            add_vertex(x_01,y,dVar32,pz,0.0,color);
            u = pz + pz;
            color_00.a = fStack_214;
            color_00.b = local_218;
            color_00._0_8_ = local_188;
            add_vertex(x,y,dVar32,u,0.0,color_00);
            x_00 = (double)fVar3;
            dVar1 = (double)fVar5;
            dVar20 = pz * 1.5;
            dVar22 = dVar19 * 0.5;
            add_vertex(x_00,y,dVar1,dVar20,dVar22,AVar30);
            color_01.a = fStack_214;
            color_01.b = local_218;
            color_01._0_8_ = local_188;
            add_vertex(x,y,dVar32,u,0.0,color_01);
            color_02.a = fStack_214;
            color_02.b = local_218;
            color_02._0_8_ = local_188;
            add_vertex(x,y,z,u,dVar19,color_02);
            add_vertex(x_00,y,dVar1,dVar20,dVar22,AVar30);
            color_03.a = fStack_214;
            color_03.b = local_218;
            color_03._0_8_ = local_188;
            add_vertex(x,y,z,u,dVar19,color_03);
            color_04.a = fStack_214;
            color_04.b = local_218;
            color_04._0_8_ = local_188;
            add_vertex(x_01,y,z,pz,dVar19,color_04);
            add_vertex(x_00,y,dVar1,dVar20,dVar22,AVar30);
            color_05.a = fStack_214;
            color_05.b = local_218;
            color_05._0_8_ = local_188;
            add_vertex(x_01,y,z,pz,dVar19,color_05);
            color_06.a = fStack_214;
            color_06.b = local_218;
            color_06._0_8_ = local_188;
            add_vertex(x_01,y,dVar32,pz,0.0,color_06);
            add_vertex(x_00,y,dVar1,dVar20,dVar22,AVar30);
            uVar31 = (ulong)(uint)ex.camera.yaxis.z;
            al_build_camera_transform(&projection_1);
            al_use_transform(&projection_1);
            bVar2 = false;
            al_draw_prim(ex.v,0,ex.skybox,0,ex.n,3,uVar31);
            al_identity_transform(&projection_1);
            al_use_transform(&projection_1);
            al_use_projection_transform(&projection);
            al_set_render_state(0x12);
            al_get_font_line_height(ex.font);
            pCVar15 = (Camera *)ex.font;
            al_draw_textf(ex.font,0,
                          "look: %+3.1f/%+3.1f/%+3.1f (change with left mouse button and drag)");
            VVar25 = get_ground_forward_vector(pCVar15);
            asin((double)(VVar25.z * ex.camera.yaxis.z +
                         VVar25.x * ex.camera.yaxis.x + VVar25.y * ex.camera.yaxis.y));
            atan2((double)ex.camera.zaxis.x,(double)ex.camera.zaxis.z);
            get_roll(pCVar15);
            al_draw_textf(ex.font,0,"pitch: %+4.0f yaw: %+4.0f roll: %+4.0f");
            al_draw_textf(ex.font,0,"vertical field of view: %3.1f (change with Z/X)");
            al_draw_textf(ex.font,0,"move with WASD or cursor");
            al_draw_textf(uVar12,ex.font,0,"control style: %s (space to change)",
                          ex.controls_names[ex.controls]);
            al_flip_display();
          }
        }
        lVar14 = (long)event.display.width;
        if (lVar14 == 0x4b) {
          ex.controls = (ex.controls + 1) % 3;
        }
        else if (event.display.width == 0x3b) {
          return 0;
        }
        ex.key[lVar14] = 1;
        ex.keystate[lVar14] = 1;
LAB_0010297d:
        if (bVar2) goto LAB_00102986;
        bVar2 = false;
      } while( true );
    }
    pcVar16 = "Error creating display\n";
  }
  abort_example(pcVar16);
  VVar25 = get_ground_right_vector((Camera *)pcVar16);
  asin((double)(VVar25.z * ex.camera.yaxis.z +
               VVar25.x * ex.camera.yaxis.x + VVar25.y * ex.camera.yaxis.y));
  return extraout_EAX;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   int redraw = 0;
   char const *skybox_name = NULL;

   if (argc > 1) {
      skybox_name = argv[1];
   }

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_init_font_addon();
   al_init_primitives_addon();
   init_platform_specific();
   al_install_keyboard();
   al_install_mouse();

   al_set_new_display_option(ALLEGRO_SAMPLE_BUFFERS, 1, ALLEGRO_SUGGEST);
   al_set_new_display_option(ALLEGRO_SAMPLES, 8, ALLEGRO_SUGGEST);
   al_set_new_display_option(ALLEGRO_DEPTH_SIZE, 16, ALLEGRO_SUGGEST);
   al_set_new_display_flags(ALLEGRO_RESIZABLE);
   display = al_create_display(640, 360);
   if (!display) {
      abort_example("Error creating display\n");
   }

   if (skybox_name) {
      al_init_image_addon();
      ex.skybox = al_load_bitmap(skybox_name);
      if (ex.skybox) {
         printf("Loaded skybox %s: %d x %d\n", skybox_name,
            al_get_bitmap_width(ex.skybox),
            al_get_bitmap_height(ex.skybox));
      }
      else {
         printf("Failed loading skybox %s\n", skybox_name);
      }
   }

   timer = al_create_timer(1.0 / 60);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));

   setup_scene();

   al_start_timer(timer);
   while (true) {
      ALLEGRO_EVENT event;

      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE)
         break;
      else if (event.type == ALLEGRO_EVENT_DISPLAY_RESIZE) {
         al_acknowledge_resize(display);
      }
      else if (event.type == ALLEGRO_EVENT_KEY_DOWN) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
            break;
         if (event.keyboard.keycode == ALLEGRO_KEY_SPACE) {
            ex.controls++;
            ex.controls %= 3;
         }
         ex.key[event.keyboard.keycode] = 1;
         ex.keystate[event.keyboard.keycode] = 1;
      }
      else if (event.type == ALLEGRO_EVENT_KEY_UP) {
         /* In case a key gets pressed and immediately released, we will still
          * have set ex.key so it is not lost.
          */
         ex.keystate[event.keyboard.keycode] = 0;
      }
      else if (event.type == ALLEGRO_EVENT_TIMER) {
         int i;
         handle_input();
         redraw = 1;

         /* Reset keyboard state for keys not held down anymore. */
         for (i = 0; i < ALLEGRO_KEY_MAX; i++) {
            if (ex.keystate[i] == 0)
               ex.key[i] = 0;
         }
         ex.mouse_dx = 0;
         ex.mouse_dy = 0;
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_DOWN) {
         ex.button[event.mouse.button] = 1;
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_UP) {
         ex.button[event.mouse.button] = 0;
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_AXES) {
         ex.mouse_dx += event.mouse.dx;
         ex.mouse_dy += event.mouse.dy;
      }

      if (redraw  && al_is_event_queue_empty(queue)) {
         draw_scene();

         al_flip_display();
         redraw = 0;
      }
   }

   return 0;
}